

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O2

void freeSignature2(signature2_t *sig,picnic_instance_t *params)

{
  proof2_t *__ptr;
  long lVar1;
  size_t i;
  ulong uVar2;
  
  if (sig != (signature2_t *)0x0) {
    free(sig->iSeedInfo);
    free(sig->cvInfo);
    lVar1 = 0x28;
    for (uVar2 = 0; __ptr = sig->proofs, uVar2 < params->num_rounds; uVar2 = uVar2 + 1) {
      if (__ptr != (proof2_t *)0x0) {
        free(*(void **)((long)__ptr + lVar1 + -0x28));
        free(*(void **)((long)__ptr + lVar1 + -0x10));
        free(*(void **)((long)__ptr + lVar1 + -8));
        free(*(void **)((long)__ptr + lVar1 + -0x18));
        free(*(void **)((long)&__ptr->seedInfo + lVar1));
      }
      lVar1 = lVar1 + 0x38;
    }
    free(__ptr);
    free(sig->challengeP);
    free(sig->challengeC);
    free(sig->challenge);
    return;
  }
  return;
}

Assistant:

void freeSignature2(signature2_t* sig, const picnic_instance_t* params) {
  if (sig) {
    free(sig->iSeedInfo);
    free(sig->cvInfo);
    for (size_t i = 0; i < params->num_rounds; i++) {
      freeProof2(&sig->proofs[i]);
    }
    free(sig->proofs);
    free(sig->challengeP);
    free(sig->challengeC);
    free(sig->challenge);
  }
}